

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O2

string * __thiscall LUPMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,LUPMatrix *this)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream out;
  Matrix MStack_1c8;
  _Vector_base<int,_std::allocator<int>_> local_1a8;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar1 = Permutation::IsIdentity(&this->row_permutation_);
  if (!bVar1) {
    Permutation::GetInverse((Permutation *)&local_1a8,&this->row_permutation_);
    Permutation::AsMatrix(&MStack_1c8,(Permutation *)&local_1a8);
    poVar2 = operator<<((ostream *)local_190,&MStack_1c8);
    poVar2 = std::operator<<(poVar2," \\ \\cdot\\");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&MStack_1c8.elements_);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1a8);
  }
  poVar2 = operator<<((ostream *)local_190,&this->l_);
  poVar2 = std::operator<<(poVar2," \\ \\cdot\\");
  std::endl<char,std::char_traits<char>>(poVar2);
  operator<<((ostream *)local_190,&this->u_);
  bVar1 = Permutation::IsIdentity(&this->column_permutation_);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"\\ \\cdot\\");
    std::endl<char,std::char_traits<char>>(poVar2);
    Permutation::AsMatrix(&MStack_1c8,&this->column_permutation_);
    operator<<((ostream *)local_190,&MStack_1c8);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&MStack_1c8.elements_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string LUPMatrix::ToLaTex() const {
  std::ostringstream out;
  if (!row_permutation_.IsIdentity()) {
      out << row_permutation_.GetInverse().AsMatrix() << R"( \ \cdot\)" << std::endl;
  }
  out << l_ << R"( \ \cdot\)" << std::endl;
  out << u_;
  if (!column_permutation_.IsIdentity()) {
      out << R"(\ \cdot\)" << std::endl;
      out << column_permutation_.AsMatrix();
  }

  return out.str();
}